

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  pointer pLVar3;
  vector<int,_std::allocator<int>_> image_height;
  optional<eos::fitting::RenderingParameters> initial_rendering_params;
  pointer ppVar4;
  pointer pfVar5;
  pointer pMVar6;
  pointer ppVar7;
  char *pcVar8;
  typed_value<boost::filesystem::path,_char> *ptVar9;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar10;
  basic_command_line_parser<char> *this;
  size_type sVar11;
  ostream *poVar12;
  basic_ostream<char,_std::char_traits<char>_> *pbVar13;
  uint uVar14;
  pointer ppVar15;
  ulong uVar16;
  int iVar17;
  pointer pMVar18;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  string *psVar19;
  pointer pfVar20;
  Mesh *pMVar21;
  pointer pLVar22;
  __m128 t_2;
  __m128 t_3;
  __m128 t;
  __m128 t_1;
  undefined7 uStack_dbf;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> landmarksfiles;
  undefined8 uStack_da0;
  vector<float,_std::allocator<float>_> pca_shape_coefficients;
  undefined8 uStack_d80;
  vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
  per_frame_rendering_params;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_fffffffffffff2a0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> imagefiles;
  path outputfile;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  Mat outimg;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> per_frame_meshes;
  Mesh neutral_expression;
  Vector4f local_b78;
  Image4u frontal_rendering;
  Matrix4f modelview_frontal;
  path outputfilebase;
  path mappingsfile;
  vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
  fitted_image_points;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  blendshape_coefficients;
  vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
  per_frame_landmarks;
  path contourfile;
  Image4u frontal_rendering_1;
  vector<int,_std::allocator<int>_> image_heights;
  vector<int,_std::allocator<int>_> image_widths;
  _Vector_base<float,_std::allocator<float>_> local_978;
  _Vector_base<float,_std::allocator<float>_> local_960;
  _Vector_base<int,_std::allocator<int>_> local_948;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  blendshapes;
  path blendshapesfile;
  path edgetopologyfile;
  path modelfile;
  EdgeTopology local_8b8;
  double local_888;
  double dStack_880;
  _Vector_base<float,_std::allocator<float>_> local_878;
  Matrix4f modelview_frontal_1;
  string local_810;
  _Vector_base<int,_std::allocator<int>_> local_7f0;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  Mat merged_texturemap;
  Scalar local_6b8;
  Texture local_698;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_678;
  _Vector_base<float,_std::allocator<float>_> local_640;
  MorphableModel morphable_model;
  Texture local_470;
  path outputfile_1;
  EdgeTopology edge_topology;
  ContourLandmarks ibug_contour;
  string local_3d0;
  WeightedIsomapAveraging texturemap_averaging;
  Matrix4f local_1f8;
  Matrix4f local_1b8;
  Matrix4f local_178;
  Matrix4f local_138;
  Mat local_f8 [96];
  undefined1 local_98 [80];
  undefined1 local_48;
  
  modelfile.m_pathname._M_dataplus._M_p = (pointer)&modelfile.m_pathname.field_2;
  modelfile.m_pathname._M_string_length = 0;
  mappingsfile.m_pathname._M_dataplus._M_p = (pointer)&mappingsfile.m_pathname.field_2;
  mappingsfile.m_pathname._M_string_length = 0;
  modelfile.m_pathname.field_2._M_local_buf[0] = '\0';
  contourfile.m_pathname._M_dataplus._M_p = (pointer)&contourfile.m_pathname.field_2;
  contourfile.m_pathname._M_string_length = 0;
  edgetopologyfile.m_pathname._M_dataplus._M_p = (pointer)&edgetopologyfile.m_pathname.field_2;
  edgetopologyfile.m_pathname._M_string_length = 0;
  mappingsfile.m_pathname.field_2._M_local_buf[0] = '\0';
  contourfile.m_pathname.field_2._M_local_buf[0] = '\0';
  blendshapesfile.m_pathname._M_dataplus._M_p = (pointer)&blendshapesfile.m_pathname.field_2;
  blendshapesfile.m_pathname._M_string_length = 0;
  outputfilebase.m_pathname._M_dataplus._M_p = (pointer)&outputfilebase.m_pathname.field_2;
  outputfilebase.m_pathname._M_string_length = 0;
  edgetopologyfile.m_pathname.field_2._M_local_buf[0] = '\0';
  blendshapesfile.m_pathname.field_2._M_local_buf[0] = '\0';
  outputfilebase.m_pathname.field_2._M_local_buf[0] = '\0';
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&morphable_model,"Allowed options",(allocator<char> *)&neutral_expression);
  boost::program_options::options_description::options_description
            ((options_description *)&texturemap_averaging,(string *)&morphable_model,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&morphable_model);
  modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array._0_8_ = boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&modelview_frontal_1,"help,h");
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&modelfile);
  ptVar9->m_required = true;
  boost::filesystem::path::path((path *)&morphable_model,"../share/sfm_shape_3448.bin");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&morphable_model);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"model,m",(char *)ptVar9);
  ptVar10 = boost::program_options::
            value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                      (&imagefiles);
  ptVar10->m_multitoken = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"image,i",(char *)ptVar10);
  ptVar10 = boost::program_options::
            value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                      (&landmarksfiles);
  ptVar10->m_multitoken = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"landmarks,l",(char *)ptVar10);
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&mappingsfile);
  ptVar9->m_required = true;
  boost::filesystem::path::path((path *)&neutral_expression,"../share/ibug_to_sfm.txt");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&neutral_expression);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"mapping,p",(char *)ptVar9);
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&contourfile);
  ptVar9->m_required = true;
  boost::filesystem::path::path((path *)&outimg,"../share/model_contours.json");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&outimg);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"model-contour,c",(char *)ptVar9);
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&edgetopologyfile);
  ptVar9->m_required = true;
  boost::filesystem::path::path((path *)&merged_texturemap,"../share/sfm_3448_edge_topology.json");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&merged_texturemap);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"edge-topology,e",(char *)ptVar9);
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&blendshapesfile);
  ptVar9->m_required = true;
  boost::filesystem::path::path
            ((path *)&modelview_frontal,"../share/expression_blendshapes_3448.bin");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&modelview_frontal);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"blendshapes,b",(char *)ptVar9);
  ptVar9 = boost::program_options::value<boost::filesystem::path>(&outputfilebase);
  ptVar9->m_required = true;
  boost::filesystem::path::path((path *)&frontal_rendering,"out");
  ptVar9 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar9,(path *)&frontal_rendering);
  boost::program_options::options_description_easy_init::operator()
            (pcVar8,(value_semantic *)"output,o",(char *)ptVar9);
  std::__cxx11::string::~string((string *)&frontal_rendering);
  std::__cxx11::string::~string((string *)&modelview_frontal);
  std::__cxx11::string::~string((string *)&merged_texturemap);
  std::__cxx11::string::~string((string *)&outimg);
  std::__cxx11::string::~string((string *)&neutral_expression);
  std::__cxx11::string::~string((string *)&morphable_model);
  boost::program_options::variables_map::variables_map((variables_map *)&morphable_model);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&neutral_expression,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&neutral_expression,
                    (options_description *)&texturemap_averaging);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&outimg,this);
  boost::program_options::store
            ((basic_parsed_options *)&outimg,(variables_map *)&morphable_model,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&outimg);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&neutral_expression);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&neutral_expression,"help",(allocator<char> *)&outimg);
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)&morphable_model.shape_model.orthonormal_pca_basis,
                   (key_type *)&neutral_expression);
  std::__cxx11::string::~string((string *)&neutral_expression);
  if (sVar11 == 0) {
    boost::program_options::notify((variables_map *)&morphable_model);
  }
  else {
    poVar12 = std::operator<<((ostream *)&std::cout,"Usage: fit-model-multi [options]");
    std::endl<char,std::char_traits<char>>(poVar12);
    boost::program_options::operator<<
              ((ostream *)&std::cout,(options_description *)&texturemap_averaging);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)&morphable_model);
  boost::program_options::options_description::~options_description
            ((options_description *)&texturemap_averaging);
  ppVar7 = imagefiles.
           super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar17 = 0;
  if (sVar11 == 0) {
    if ((long)landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)imagefiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)imagefiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (landmarksfiles.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          landmarksfiles.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        for (ppVar15 = imagefiles.
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppVar4 = landmarksfiles.
                     super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                     ._M_impl.super__Vector_impl_data._M_finish, ppVar15 != ppVar7;
            ppVar15 = ppVar15 + 1) {
          cv::imread((string *)&morphable_model,(int)ppVar15);
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                    (&images,(Mat *)&morphable_model);
          cv::Mat::~Mat((Mat *)&morphable_model);
        }
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (psVar19 = (string *)
                       landmarksfiles.
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar19 != (string *)ppVar4;
            psVar19 = psVar19 + 0x20) {
          std::__cxx11::string::string((string *)&local_3d0,psVar19);
          eos::core::read_pts_landmarks
                    ((LandmarkCollection<Eigen::Vector2f> *)&morphable_model,&local_3d0);
          std::
          vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>,std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>>
          ::
          emplace_back<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                    ((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>,std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>>
                      *)&per_frame_landmarks,
                     (vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                      *)&morphable_model);
          std::
          vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
          ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     *)&morphable_model);
          std::__cxx11::string::~string((string *)&local_3d0);
        }
        morphable_model.expression_model.
        super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
        ._M_engaged = false;
        morphable_model.landmark_definitions.
        super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        ._M_engaged = false;
        memset(&morphable_model,0,0xd0);
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&local_738,(string *)&modelfile);
        eos::morphablemodel::load_model((MorphableModel *)&texturemap_averaging,&local_738);
        eos::morphablemodel::MorphableModel::operator=
                  (&morphable_model,(MorphableModel *)&texturemap_averaging);
        eos::morphablemodel::MorphableModel::~MorphableModel
                  ((MorphableModel *)&texturemap_averaging);
        std::__cxx11::string::~string((string *)&local_738);
        if (mappingsfile.m_pathname._M_string_length == 0) {
          local_678._M_buckets = &local_678._M_single_bucket;
          local_678._M_bucket_count = 1;
          local_678._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_678._M_element_count = 0;
          local_678._M_rehash_policy._M_max_load_factor = 1.0;
          local_678._M_rehash_policy._4_4_ = 0;
          local_678._M_rehash_policy._M_next_resize = 0;
          local_678._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          std::__cxx11::string::string((string *)&local_758,(string *)&mappingsfile);
          eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)&local_678,&local_758);
          std::__cxx11::string::~string((string *)&local_758);
        }
        std::__cxx11::string::string((string *)&local_778,(string *)&blendshapesfile);
        eos::morphablemodel::load_blendshapes(&blendshapes,&local_778);
        std::__cxx11::string::~string((string *)&local_778);
        if (contourfile.m_pathname._M_string_length == 0) {
          local_8b8.adjacent_vertices.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_8b8.adjacent_vertices.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_8b8.adjacent_faces.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_8b8.adjacent_vertices.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_8b8.adjacent_faces.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_8b8.adjacent_faces.
          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
        else {
          std::__cxx11::string::string((string *)&local_798,(string *)&contourfile);
          eos::fitting::ModelContour::load((ModelContour *)&local_8b8,&local_798);
          std::__cxx11::string::~string((string *)&local_798);
        }
        std::__cxx11::string::string((string *)&local_7b8,(string *)&mappingsfile);
        eos::fitting::ContourLandmarks::load(&ibug_contour,&local_7b8);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::string((string *)&local_7d8,(string *)&edgetopologyfile);
        eos::morphablemodel::load_edge_topology(&edge_topology,&local_7d8);
        std::__cxx11::string::~string((string *)&local_7d8);
        pMVar6 = images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        for (pMVar18 = images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start; pMVar18 != pMVar6; pMVar18 = pMVar18 + 0x60
            ) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&image_widths,(value_type *)(pMVar18 + 0xc));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&image_heights,(value_type *)(pMVar18 + 8));
        }
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_948,&image_widths);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_7f0,&image_heights);
        local_48 = 0;
        uStack_dbf = (undefined7)((ulong)&fitted_image_points >> 8);
        image_height.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&edge_topology;
        image_height.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_7f0;
        image_height.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)&ibug_contour;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._8_1_ =
             (char)&fitted_image_points;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._0_8_ =
             &blendshape_coefficients;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._9_7_ =
             uStack_dbf;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._16_8_ =
             landmarksfiles.
             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_start;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._24_8_ =
             landmarksfiles.
             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._32_8_ =
             landmarksfiles.
             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._40_8_ =
             uStack_da0;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._48_8_ =
             pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._M_value.t_z.
        super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
             (optional<float>)
             (optional<float>)
             pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._M_value.fov_y.
        super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
             (optional<float>)
             (optional<float>)
             pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_payload._72_8_ =
             uStack_d80;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._80_8_ =
             per_frame_rendering_params.
             super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
             ._M_impl.super__Vector_impl_data._M_start;
        initial_rendering_params.
        super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._88_8_ =
             per_frame_rendering_params.
             super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        eos::fitting::fit_shape_and_pose
                  ((pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
                    *)&texturemap_averaging,&morphable_model,&blendshapes,&per_frame_landmarks,
                   (LandmarkMapper *)&local_678,(vector<int,_std::allocator<int>_> *)&local_948,
                   image_height,&local_8b8,(ContourLandmarks *)0x5,(ModelContour *)0x0,(int)local_98
                   ,(optional<int>)&pca_shape_coefficients,30.0,initial_rendering_params,
                   (vector<float,_std::allocator<float>_> *)
                   per_frame_rendering_params.
                   super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_fffffffffffff2a0,
                   (vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                    *)images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&per_frame_rendering_params;
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&per_frame_meshes;
        std::
        tuple<std::vector<eos::core::Mesh,std::allocator<eos::core::Mesh>>&,std::vector<eos::fitting::RenderingParameters,std::allocator<eos::fitting::RenderingParameters>>&>
        ::operator=((tuple<std::vector<eos::core::Mesh,std::allocator<eos::core::Mesh>>&,std::vector<eos::fitting::RenderingParameters,std::allocator<eos::fitting::RenderingParameters>>&>
                     *)&neutral_expression,
                    (pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
                     *)&texturemap_averaging);
        std::
        pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
        ::~pair((pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
                 *)&texturemap_averaging);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7f0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_948);
        std::operator<<((ostream *)&std::cout,"Final pca shape coefficients: ");
        pfVar5 = pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pfVar20 = pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start; pfVar20 != pfVar5;
            pfVar20 = pfVar20 + 1) {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,*pfVar20);
          std::operator<<(poVar12,' ');
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        WeightedIsomapAveraging::WeightedIsomapAveraging(&texturemap_averaging,60.0);
        cv::Mat::Mat(&merged_texturemap);
        uVar14 = 0;
        local_888 = 0.0;
        dStack_880 = 255.0;
        while( true ) {
          uVar16 = (ulong)uVar14;
          if ((ulong)(((long)images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60) <= uVar16) break;
          eos::fitting::RenderingParameters::get_yaw_pitch_roll
                    ((RenderingParameters *)&neutral_expression);
          pMVar21 = per_frame_meshes.
                    super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar16;
          eos::fitting::RenderingParameters::get_modelview
                    (&local_138,
                     per_frame_rendering_params.
                     super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
          eos::fitting::RenderingParameters::get_projection
                    (&local_178,
                     per_frame_rendering_params.
                     super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
          eos::core::from_mat_with_alpha
                    ((Image4u *)&neutral_expression,
                     images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar16 * 0x60);
          eos::render::extract_texture
                    ((Image4u *)&outputfile,pMVar21,&local_138,&local_178,Orthographic,
                     (Image4u *)&neutral_expression,0x200);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &neutral_expression.vertices.
                      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cv::Mat::clone();
          pLVar3 = per_frame_landmarks.
                   super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].
                   super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pLVar22 = per_frame_landmarks.
                         super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].
                         super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pLVar22 != pLVar3;
              pLVar22 = pLVar22 + 1) {
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[4] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[5] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0] = 3.7909693e-37;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array._8_8_ = &outimg;
            fVar1 = (pLVar22->coordinates).
                    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                    array[0];
            fVar2 = (pLVar22->coordinates).
                    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                    array[1];
            local_ce0 = (int)ROUND(fVar1 + -2.0);
            local_cdc = (int)ROUND(fVar2 + -2.0);
            local_ce8 = (int)ROUND(fVar1 + 2.0);
            local_ce4 = (int)ROUND(fVar2 + 2.0);
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&neutral_expression);
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x406fe00000000000;
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            neutral_expression.colors.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            cv::rectangle(&modelview_frontal,&local_ce0,&local_ce8,&neutral_expression,1,8,0);
          }
          cv::Mat::Mat(local_f8,&outimg);
          pMVar21 = per_frame_meshes.
                    super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar16;
          eos::fitting::RenderingParameters::get_modelview
                    (&local_1b8,
                     per_frame_rendering_params.
                     super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
          eos::fitting::RenderingParameters::get_projection
                    (&local_1f8,
                     per_frame_rendering_params.
                     super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
          local_b78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
          array[0] = 0.0;
          iVar17 = (int)*(undefined8 *)
                         (images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar16 * 0x60 + 8);
          local_b78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
          array[3] = (float)-iVar17;
          local_b78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
          array[1] = (float)iVar17;
          local_b78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
          array[2] = (float)(int)((ulong)*(undefined8 *)
                                          (images.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                          uVar16 * 0x60 + 8) >> 0x20);
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_6b8);
          local_6b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = local_888;
          local_6b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = dStack_880;
          local_6b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = local_888;
          local_6b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = dStack_880;
          eos::render::draw_wireframe(local_f8,pMVar21,&local_1b8,&local_1f8,&local_b78,&local_6b8);
          cv::Mat::~Mat(local_f8);
          std::__cxx11::string::string((string *)&outputfile_1,(string *)&outputfilebase);
          boost::filesystem::path::stem();
          std::__cxx11::string::append((string *)&outputfile_1);
          std::__cxx11::string::~string((string *)&neutral_expression);
          boost::filesystem::path::path((path *)&neutral_expression,".png");
          std::__cxx11::string::append((string *)&outputfile_1);
          std::__cxx11::string::~string((string *)&neutral_expression);
          neutral_expression.vertices.
          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          neutral_expression.vertices.
          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(neutral_expression.vertices.
                                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
          neutral_expression.vertices.
          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&outimg;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[0] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[1] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[2] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[3] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[4] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[5] = 0.0;
          cv::imwrite((string *)&outputfile_1,(_InputArray *)&neutral_expression,
                      (vector *)&modelview_frontal);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&modelview_frontal);
          Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
          Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
          _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                    ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&modelview_frontal_1,
                     (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      *)&neutral_expression);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_640,&pca_shape_coefficients);
          eos::morphablemodel::PcaModel::draw_sample
                    ((PcaModel *)&frontal_rendering,
                     (vector<float,_std::allocator<float>_> *)&morphable_model);
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[0] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[1] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[2] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[3] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[4] = 0.0;
          modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[5] = 0.0;
          eos::morphablemodel::sample_to_mesh
                    (&neutral_expression,(VectorXf *)&frontal_rendering,
                     &morphable_model.color_model.mean,&morphable_model.shape_model.triangle_list,
                     &morphable_model.color_model.triangle_list,&morphable_model.texture_coordinates
                     ,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                      &modelview_frontal);
          std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
          ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         *)&modelview_frontal);
          free((void *)CONCAT44(frontal_rendering.width_,frontal_rendering.height_));
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_640);
          eos::render::ortho<float>((Matrix4<float> *)&modelview_frontal,-130.0,130.0,-130.0,130.0);
          eos::render::create_mipmapped_texture(&local_470,(Image4u *)&outputfile,0);
          eos::render::render(&frontal_rendering_1,&neutral_expression,&modelview_frontal_1,
                              &modelview_frontal,0x100,0x100,&local_470,true,false,false);
          std::
          vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
          ::~vector(&local_470.mipmaps);
          boost::filesystem::path::path((path *)&modelview_frontal,".frontal.png");
          boost::filesystem::path::replace_extension(&outputfile_1);
          std::__cxx11::string::~string((string *)&modelview_frontal);
          eos::core::to_mat((core *)&modelview_frontal,&frontal_rendering_1);
          frontal_rendering.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          frontal_rendering.height_ = 0x1010000;
          local_c48 = 0;
          uStack_c40 = 0;
          local_c38 = 0;
          frontal_rendering._8_8_ = (string *)&modelview_frontal;
          cv::imwrite((string *)&outputfile_1,(_InputArray *)&frontal_rendering,(vector *)&local_c48
                     );
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_c48);
          cv::Mat::~Mat((Mat *)&modelview_frontal);
          boost::filesystem::path::path((path *)&modelview_frontal,"");
          boost::filesystem::path::replace_extension(&outputfile_1);
          std::__cxx11::string::~string((string *)&modelview_frontal);
          eos::core::to_mat((core *)&modelview_frontal,(Image4u *)&outputfile);
          boost::filesystem::path::path((path *)&frontal_rendering,".texture.png");
          boost::filesystem::path::replace_extension(&outputfile_1);
          std::__cxx11::string::~string((string *)&frontal_rendering);
          frontal_rendering.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          frontal_rendering.height_ = 0x1010000;
          local_c48 = 0;
          uStack_c40 = 0;
          local_c38 = 0;
          frontal_rendering._8_8_ = (string *)&modelview_frontal;
          cv::imwrite((string *)&outputfile_1,(_InputArray *)&frontal_rendering,(vector *)&local_c48
                     );
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_c48);
          WeightedIsomapAveraging::add_and_merge
                    ((WeightedIsomapAveraging *)&frontal_rendering,
                     &texturemap_averaging.visibility_counter);
          cv::Mat::operator=(&merged_texturemap,(Mat *)&frontal_rendering);
          cv::Mat::~Mat((Mat *)&frontal_rendering);
          cv::Mat::~Mat((Mat *)&modelview_frontal);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&frontal_rendering_1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          eos::core::Mesh::~Mesh(&neutral_expression);
          std::__cxx11::string::~string((string *)&outputfile_1);
          cv::Mat::~Mat(&outimg);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &outputfile.m_pathname.field_2);
          uVar14 = uVar14 + 1;
        }
        std::__cxx11::string::string((string *)&outputfile,(string *)&outputfilebase);
        boost::filesystem::path::path((path *)&neutral_expression,"merged.texture.png");
        std::__cxx11::string::append((string *)&outputfile);
        std::__cxx11::string::~string((string *)&neutral_expression);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(neutral_expression.vertices.
                               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&merged_texturemap;
        _outimg = (pointer)0x0;
        cv::imwrite((string *)&outputfile,(_InputArray *)&neutral_expression,(vector *)&outimg);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&outimg);
        boost::filesystem::path::path((path *)&neutral_expression,"");
        boost::filesystem::path::replace_extension(&outputfile);
        std::__cxx11::string::~string((string *)&neutral_expression);
        Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
        Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
        _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                  ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&modelview_frontal,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *)&neutral_expression);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_960,&pca_shape_coefficients);
        eos::morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)&frontal_rendering,
                   (vector<float,_std::allocator<float>_> *)&morphable_model);
        _outimg = (pointer)0x0;
        eos::morphablemodel::sample_to_mesh
                  (&neutral_expression,(VectorXf *)&frontal_rendering,
                   &morphable_model.color_model.mean,&morphable_model.shape_model.triangle_list,
                   &morphable_model.color_model.triangle_list,&morphable_model.texture_coordinates,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&outimg);
        std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                      &outimg);
        free((void *)CONCAT44(frontal_rendering.width_,frontal_rendering.height_));
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_960);
        eos::render::ortho<float>((Matrix4<float> *)&outimg,-130.0,130.0,-130.0,130.0);
        eos::core::from_mat_with_alpha((Image4u *)&modelview_frontal_1,&merged_texturemap);
        eos::render::create_mipmapped_texture(&local_698,(Image4u *)&modelview_frontal_1,0);
        eos::render::render(&frontal_rendering,&neutral_expression,&modelview_frontal,
                            (Matrix4f *)&outimg,0x200,0x200,&local_698,true,false,false);
        std::
        vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
        ::~vector(&local_698.mipmaps);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                    m_storage.m_data.array + 4));
        boost::filesystem::path::path((path *)&outimg,".frontal.png");
        boost::filesystem::path::replace_extension(&outputfile);
        std::__cxx11::string::~string((string *)&outimg);
        eos::core::to_mat((core *)&outimg,&frontal_rendering);
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[4] = 0.0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[5] = 0.0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0] = 2.3693558e-38;
        frontal_rendering_1.height_ = 0;
        frontal_rendering_1.width_ = 0;
        frontal_rendering_1.row_stride = 0;
        frontal_rendering_1._12_4_ = 0;
        frontal_rendering_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array._8_8_ = (core *)&outimg;
        cv::imwrite((string *)&outputfile,(_InputArray *)&modelview_frontal_1,
                    (vector *)&frontal_rendering_1);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&frontal_rendering_1);
        cv::Mat::~Mat(&outimg);
        boost::filesystem::path::path((path *)&outimg,"");
        boost::filesystem::path::replace_extension(&outputfile);
        std::__cxx11::string::~string((string *)&outimg);
        boost::filesystem::path::path((path *)&outimg,".obj");
        boost::filesystem::path::replace_extension(&outputfile);
        std::__cxx11::string::~string((string *)&outimg);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_978,&pca_shape_coefficients);
        local_878._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_878._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_878._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        eos::morphablemodel::MorphableModel::draw_sample
                  ((Mesh *)&outimg,&morphable_model,
                   (vector<float,_std::allocator<float>_> *)&local_978,
                   (vector<float,_std::allocator<float>_> *)&local_878);
        std::__cxx11::string::string((string *)&local_810,(string *)&outputfile);
        eos::core::write_textured_obj((Mesh *)&outimg,&local_810);
        std::__cxx11::string::~string((string *)&local_810);
        eos::core::Mesh::~Mesh((Mesh *)&outimg);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_878);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_978);
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  "Finished fitting and wrote result mesh and texture to files with basename "
                                 );
        pbVar13 = boost::filesystem::operator<<(poVar12,&outputfilebase);
        poVar12 = std::operator<<(pbVar13,".");
        std::endl<char,std::char_traits<char>>(poVar12);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&frontal_rendering.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        eos::core::Mesh::~Mesh(&neutral_expression);
        std::__cxx11::string::~string((string *)&outputfile);
        cv::Mat::~Mat(&merged_texturemap);
        WeightedIsomapAveraging::~WeightedIsomapAveraging(&texturemap_averaging);
        std::
        vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ::~vector(&fitted_image_points);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&blendshape_coefficients);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&image_heights.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&image_widths.super__Vector_base<int,_std::allocator<int>_>);
        std::
        _Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ::~_Vector_base(&per_frame_rendering_params.
                         super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       );
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::~vector(&per_frame_meshes);
        eos::morphablemodel::EdgeTopology::~EdgeTopology(&edge_topology);
        eos::fitting::ContourLandmarks::~ContourLandmarks(&ibug_contour);
        eos::fitting::ModelContour::~ModelContour((ModelContour *)&local_8b8);
        std::
        vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>::
        ~vector(&blendshapes);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_678);
        iVar17 = 0;
        eos::morphablemodel::MorphableModel::~MorphableModel(&morphable_model);
        std::
        vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ::~vector(&per_frame_landmarks);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&images);
        goto LAB_0010c430;
      }
      poVar12 = std::operator<<((ostream *)&std::cout,
                                "Please give at least 1 image and landmark file.");
    }
    else {
      poVar12 = std::operator<<((ostream *)&std::cout,
                                "Number of landmarks files not equal to number of images given: ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12,"!=");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    }
    std::endl<char,std::char_traits<char>>(poVar12);
    iVar17 = 1;
  }
LAB_0010c430:
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            (&landmarksfiles);
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            (&imagefiles);
  std::__cxx11::string::~string((string *)&outputfilebase);
  std::__cxx11::string::~string((string *)&blendshapesfile);
  std::__cxx11::string::~string((string *)&edgetopologyfile);
  std::__cxx11::string::~string((string *)&contourfile);
  std::__cxx11::string::~string((string *)&mappingsfile);
  std::__cxx11::string::~string((string *)&modelfile);
  return iVar17;
}

Assistant:

int main(int argc, char *argv[])
{
    // Note: Could make these all std::string, see fit-model.cpp.
    fs::path modelfile, mappingsfile, contourfile, edgetopologyfile, blendshapesfile, outputfilebase;
    vector<fs::path> imagefiles, landmarksfiles;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<fs::path>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<vector<fs::path>>(&imagefiles)->multitoken(),
                "an input image")
            ("landmarks,l", po::value<vector<fs::path>>(&landmarksfiles)->multitoken(),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<fs::path>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("model-contour,c", po::value<fs::path>(&contourfile)->required()->default_value("../share/model_contours.json"),
                "file with model contour indices")
            ("edge-topology,e", po::value<fs::path>(&edgetopologyfile)->required()->default_value("../share/sfm_3448_edge_topology.json"),
                "file with model's precomputed edge topology")
            ("blendshapes,b", po::value<fs::path>(&blendshapesfile)->required()->default_value("../share/expression_blendshapes_3448.bin"),
                "file with blendshapes")
            ("output,o", po::value<fs::path>(&outputfilebase)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-multi [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.size() != imagefiles.size()) {
        cout << "Number of landmarks files not equal to number of images given: " << landmarksfiles.size()
             << "!=" << imagefiles.size() << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.empty()) {
        cout << "Please give at least 1 image and landmark file." << endl;
        return EXIT_FAILURE;
    }
    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    vector<Mat> images;
    for (const auto& imagefile : imagefiles){
        images.push_back(cv::imread(imagefile.string()));
    }
    vector<LandmarkCollection<Eigen::Vector2f>> per_frame_landmarks;
    try
    {
        for (const auto& landmarksfile : landmarksfiles)
        {
            per_frame_landmarks.push_back(core::read_pts_landmarks(landmarksfile.string()));
        }
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile.string());
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map ibug landmark identifiers to vertex ids:
    core::LandmarkMapper landmark_mapper =
        mappingsfile.empty() ? core::LandmarkMapper() : core::LandmarkMapper(mappingsfile.string());

    // The expression blendshapes:
    vector<morphablemodel::Blendshape> blendshapes =
        morphablemodel::load_blendshapes(blendshapesfile.string());

    // These two are used to fit the front-facing contour to the ibug contour landmarks:
    fitting::ModelContour model_contour =
        contourfile.empty() ? fitting::ModelContour() : fitting::ModelContour::load(contourfile.string());
    fitting::ContourLandmarks ibug_contour = fitting::ContourLandmarks::load(mappingsfile.string());

    // The edge topology is used to speed up computation of the occluding face contour fitting:
    morphablemodel::EdgeTopology edge_topology =
        morphablemodel::load_edge_topology(edgetopologyfile.string());

    // Fit the model, get back a mesh and the pose:
    vector<core::Mesh> per_frame_meshes;
    vector<fitting::RenderingParameters> per_frame_rendering_params;
    vector<int> image_widths;
    vector<int> image_heights;
    for (const auto& image : images)
    {
        image_widths.push_back(image.cols);
        image_heights.push_back(image.rows);
    }

    vector<float> pca_shape_coefficients;
    vector<vector<float>> blendshape_coefficients;
    vector<vector<Eigen::Vector2f>> fitted_image_points;

    std::tie(per_frame_meshes, per_frame_rendering_params) = fitting::fit_shape_and_pose(
        morphable_model, blendshapes, per_frame_landmarks, landmark_mapper, image_widths, image_heights, edge_topology,
        ibug_contour, model_contour, 5, cpp17::nullopt, 30.0f, cpp17::nullopt, pca_shape_coefficients,
        blendshape_coefficients, fitted_image_points);

    cout << "Final pca shape coefficients: ";
    for (auto i : pca_shape_coefficients)
    {
        cout << i << ' ';
    }
    cout << endl;

    WeightedIsomapAveraging texturemap_averaging(60.f); // merge all triangles that are facing <60° towards the camera
    Mat merged_texturemap;
    for (unsigned i = 0; i < images.size(); ++i)
    {
        // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw,
        // pitch, and roll angles:
        const float yaw_angle = per_frame_rendering_params[i].get_yaw_pitch_roll()[0];

        // Extract the texture from the image using given mesh and camera parameters:
        // Have to fiddle around with converting between core::Image and cv::Mat
        const core::Image4u texturemap = render::extract_texture(
            per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
            per_frame_rendering_params[i].get_projection(), render::ProjectionType::Orthographic,
            core::from_mat_with_alpha(images[i]));

        // Draw the loaded landmarks:
        Mat outimg = images[i].clone();
        for (const auto& lm : per_frame_landmarks[i])
        {
            cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                          cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
        }

        // Draw the fitted mesh as wireframe, and save the image:
        render::draw_wireframe(outimg, per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
                               per_frame_rendering_params[i].get_projection(),
                               fitting::get_opencv_viewport(images[i].cols, images[i].rows));
        fs::path outputfile = outputfilebase;
        outputfile += fs::path(imagefiles[i].stem());
        outputfile += fs::path(".png");
        cv::imwrite(outputfile.string(), outimg);

        // Save frontal rendering with texture:
        Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
        core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
            morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
            morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
        const core::Image4u frontal_rendering = render::render(
            neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 256, 256,
            render::create_mipmapped_texture(texturemap), true, false, false);
        outputfile.replace_extension(".frontal.png");
        cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
        outputfile.replace_extension("");

        cv::Mat texturemap_opencv = core::to_mat(texturemap);

        // And save the texture map:
        outputfile.replace_extension(".texture.png");
        cv::imwrite(outputfile.string(), texturemap_opencv);

        // Merge the texture maps:
        merged_texturemap = texturemap_averaging.add_and_merge(texturemap_opencv);
    }

    // Save the merged texture map:
    fs::path outputfile = outputfilebase;
    outputfile += fs::path("merged.texture.png");
    cv::imwrite(outputfile.string(), merged_texturemap);
    outputfile.replace_extension("");

    // Save the frontal rendering with merged texture:
    Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
    core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
        morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
        morphable_model.get_color_model().get_mean(), morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
    const core::Image4u frontal_rendering = render::render(
        neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 512, 512,
        render::create_mipmapped_texture(core::from_mat_with_alpha(merged_texturemap)), true, false, false);
    outputfile.replace_extension(".frontal.png");
    cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
    outputfile.replace_extension("");

    // Save the mesh as textured obj:
    outputfile.replace_extension(".obj");
    core::write_textured_obj(morphable_model.draw_sample(pca_shape_coefficients, std::vector<float>()),
                             outputfile.string());

    cout << "Finished fitting and wrote result mesh and texture to files with basename " << outputfilebase
         << "." << endl;

    return EXIT_SUCCESS;
}